

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O2

int get_trust(CHAR_DATA *ch)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  if ((ch->desc != (DESCRIPTOR_DATA *)0x0) &&
     (pCVar1 = ch->desc->original, pCVar1 != (CHAR_DATA *)0x0)) {
    ch = pCVar1;
  }
  iVar3 = (int)ch->trust;
  if (ch->trust == 0) {
    bVar2 = is_npc(ch);
    iVar4 = (int)ch->level;
    iVar3 = 0x32;
    if (iVar4 < 0x33) {
      iVar3 = iVar4;
    }
    if (!bVar2) {
      iVar3 = iVar4;
    }
  }
  return iVar3;
}

Assistant:

int get_trust(CHAR_DATA *ch)
{
	if (ch->desc != nullptr && ch->desc->original != nullptr)
		ch = ch->desc->original;

	if (ch->trust)
		return ch->trust;

	if (is_npc(ch) && ch->level >= LEVEL_HERO)
		return LEVEL_HERO - 1;
	else
		return ch->level;
}